

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

void crunch(membuf *inbuf,membuf *outbuf,crunch_options *options,crunch_info *info)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  int outpos;
  crunch_info *info_local;
  crunch_options *options_local;
  membuf *outbuf_local;
  membuf *inbuf_local;
  
  pcVar3 = (char *)membuf_get(inbuf);
  iVar1 = membuf_memlen(inbuf);
  reverse_buffer(pcVar3,iVar1);
  iVar1 = membuf_memlen(outbuf);
  crunch_backwards(inbuf,outbuf,options,info);
  pcVar3 = (char *)membuf_get(inbuf);
  iVar2 = membuf_memlen(inbuf);
  reverse_buffer(pcVar3,iVar2);
  pvVar4 = membuf_get(outbuf);
  iVar2 = membuf_memlen(outbuf);
  reverse_buffer((char *)((long)pvVar4 + (long)iVar1),iVar2 - iVar1);
  return;
}

Assistant:

void crunch(struct membuf *inbuf,
            struct membuf *outbuf,
            struct crunch_options *options, /* IN */
            struct crunch_info *info) /* OUT */
{
    int outpos;
    reverse_buffer(membuf_get(inbuf), membuf_memlen(inbuf));
    outpos = membuf_memlen(outbuf);

    crunch_backwards(inbuf, outbuf, options, info);

    reverse_buffer(membuf_get(inbuf), membuf_memlen(inbuf));
    reverse_buffer((char*)membuf_get(outbuf) + outpos,
                   membuf_memlen(outbuf) - outpos);
}